

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

void __thiscall
VulkanHppGenerator::VulkanHppGenerator(VulkanHppGenerator *this,XMLDocument *document,string *api)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr p_Var4;
  int line;
  pointer pcVar5;
  pointer pFVar6;
  pointer pEVar7;
  bool bVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  VulkanHppGenerator *this_00;
  long lVar14;
  FeatureData *feature;
  ulong __val;
  pointer requiredBy;
  ExtensionData *extension;
  pointer pEVar15;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> elements;
  string __str;
  XMLElement *childElement;
  allocator_type local_45a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_459;
  vector<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_> local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_440;
  _Base_ptr local_438;
  _Base_ptr local_430;
  DefinesPartition *local_428;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  *local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_418 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>_>_>
  *local_368;
  undefined1 local_360 [32];
  undefined1 auStack_340 [56];
  size_t local_308;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  local_300 [6];
  undefined1 local_1b8 [32];
  _Base_ptr local_198;
  size_t local_190;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_188;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_158;
  _Alloc_hider local_128;
  size_type local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _Alloc_hider local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_88;
  bool local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  
  paVar12 = &(this->m_api).field_2;
  (this->m_api)._M_dataplus._M_p = (pointer)paVar12;
  pcVar5 = (api->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar5,pcVar5 + api->_M_string_length);
  p_Var1 = &(this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_baseTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_bitmasks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_commandQueues)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_commands)._M_t._M_impl.super__Rb_tree_header;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_constants)._M_t._M_impl.super__Rb_tree_header;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_constants)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_420 = &this->m_defines;
  p_Var1 = &(this->m_defines)._M_t._M_impl.super__Rb_tree_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_428 = &this->m_definesPartition;
  local_438 = &(this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header;
  *(undefined8 *)&(this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_defines)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_definesPartition).callees._M_t._M_impl = 0;
  (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       local_438;
  (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_438;
  local_430 = &(this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_definesPartition).callers._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       local_430;
  (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_430;
  p_Var1 = &(this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header;
  (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_definesPartition).values._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header = 0
  ;
  (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_enumExtends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_enums)._M_t._M_impl.super__Rb_tree_header;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  p_Var2 = &(this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_extensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_extensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_enums)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_extensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header
  ;
  p_Var2 = &(this->m_formats)._M_t._M_impl.super__Rb_tree_header;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_features).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_features).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_externalTypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_features).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_formats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_funcPointers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_handles)._M_t._M_impl.super__Rb_tree_header;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_handles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_includes)._M_t._M_impl.super__Rb_tree_header;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_includes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_platforms)._M_t._M_impl.super__Rb_tree_header;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_platforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_RAIISpecialFunctions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_spirVCapabilities)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_structs)._M_t._M_impl.super__Rb_tree_header;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  p_Var2 = &(this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_structsAliases).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_structsAliases).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_structsAliases).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::NameLine>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_syncAccesses)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_syncStages)._M_t._M_impl.super__Rb_tree_header;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_syncStages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_tags)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->m_tags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_370 = &(this->m_version).field_2;
  (this->m_unsupportedFeatures).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_unsupportedFeatures).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_unsupportedFeatures).
  super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unsupportedExtensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unsupportedExtensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_unsupportedExtensions).
  super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_version)._M_dataplus._M_p = (pointer)local_370;
  (this->m_version)._M_string_length = 0;
  (this->m_version).field_2._M_local_buf[0] = '\0';
  (this->m_videoCodecs).
  super__Vector_base<VulkanHppGenerator::VideoCodec,_std::allocator<VulkanHppGenerator::VideoCodec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_videoCodecs).
  super__Vector_base<VulkanHppGenerator::VideoCodec,_std::allocator<VulkanHppGenerator::VideoCodec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_videoCodecs).
  super__Vector_base<VulkanHppGenerator::VideoCodec,_std::allocator<VulkanHppGenerator::VideoCodec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vulkanLicenseHeader)._M_dataplus._M_p = (pointer)&(this->m_vulkanLicenseHeader).field_2;
  (this->m_vulkanLicenseHeader)._M_string_length = 0;
  (this->m_vulkanLicenseHeader).field_2._M_local_buf[0] = '\0';
  p_Var4 = (_Base_ptr)(local_1b8 + 8);
  local_1b8._16_8_ = (_Base_ptr)0x0;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = 0;
  _Stack_188.super__Rb_tree_header._M_header._M_left = &_Stack_188.super__Rb_tree_header._M_header;
  local_190 = 0;
  _Stack_188._0_8_ = 0;
  _Stack_188.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_188.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_188.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_158.super__Rb_tree_header._M_header._M_left = &_Stack_158.super__Rb_tree_header._M_header;
  _Stack_188.super__Rb_tree_header._M_node_count = 0;
  _Stack_158._0_8_ = 0;
  _Stack_158.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_158.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_158.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_158.super__Rb_tree_header._M_node_count = 0;
  local_128._M_p = (pointer)&local_118;
  local_120 = 0;
  local_118._M_local_buf[0] = '\0';
  local_108._M_p = (pointer)&local_f8;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  local_e8._M_p = (pointer)&local_d8;
  local_e0 = 0;
  local_d8._M_local_buf[0] = '\0';
  local_c8._M_p = (pointer)&local_b8;
  local_c0 = 0;
  local_b8._M_local_buf[0] = '\0';
  local_a8._M_p = (pointer)&local_98;
  local_a0 = 0;
  local_98._M_local_buf[0] = '\0';
  local_88.super__Rb_tree_header._M_header._M_left = &local_88.super__Rb_tree_header._M_header;
  local_88.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._0_8_ = 0;
  local_88.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88.super__Rb_tree_header._M_node_count = 0;
  local_58 = false;
  local_54 = 0;
  uStack_4c = 0;
  local_44 = 0;
  uStack_3c = 0;
  local_34 = 0;
  local_368 = &this->m_handles;
  local_1b8._24_8_ = p_Var4;
  local_198 = p_Var4;
  _Stack_188.super__Rb_tree_header._M_header._M_right =
       _Stack_188.super__Rb_tree_header._M_header._M_left;
  _Stack_158.super__Rb_tree_header._M_header._M_right =
       _Stack_158.super__Rb_tree_header._M_header._M_left;
  local_88.super__Rb_tree_header._M_header._M_right =
       local_88.super__Rb_tree_header._M_header._M_left;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
  ::pair<const_char_(&)[1],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
              *)local_360,(char (*) [1])0x236ed6,(HandleData *)local_1b8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>,std::_Select1st<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,VulkanHppGenerator::HandleData>>>
              *)&this->m_handles,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::HandleData>
              *)local_360);
  HandleData::~HandleData((HandleData *)auStack_340);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  HandleData::~HandleData((HandleData *)local_1b8);
  line = (document->super_XMLNode)._parseLineNum;
  local_458.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (XMLElement **)0x0;
  local_458.
  super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (XMLElement **)0x0;
  local_360._0_8_ = tinyxml2::XMLNode::FirstChildElement(&document->super_XMLNode,(char *)0x0);
  for (; (XMLElement *)local_360._0_8_ != (XMLElement *)0x0;
      local_360._0_8_ =
           tinyxml2::XMLNode::NextSiblingElement((XMLNode *)local_360._0_8_,(char *)0x0)) {
    if (local_458.
        super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_458.
        super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>>::
      _M_realloc_insert<tinyxml2::XMLElement_const*const&>
                ((vector<tinyxml2::XMLElement_const*,std::allocator<tinyxml2::XMLElement_const*>> *)
                 &local_458,
                 (iterator)
                 local_458.
                 super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(XMLElement **)local_360);
    }
    else {
      *local_458.
       super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = (XMLElement *)local_360._0_8_;
      local_458.
      super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_458.
           super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  paVar3 = &local_418[0].first.field_2;
  local_440 = paVar12;
  local_418[0].first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"registry","");
  local_418[0].second = true;
  __l._M_len = 1;
  __l._M_array = local_418;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)local_360,__l,&local_459,&local_45a);
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = 0;
  local_1b8._16_8_ = (_Base_ptr)0x0;
  local_190 = 0;
  local_1b8._24_8_ = p_Var4;
  local_198 = p_Var4;
  checkElements(line,&local_458,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                 *)local_360,
                (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               *)local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418[0].first._M_dataplus._M_p != paVar3) {
    operator_delete(local_418[0].first._M_dataplus._M_p,
                    local_418[0].first.field_2._M_allocated_capacity + 1);
  }
  lVar14 = (long)local_458.
                 super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_458.
                 super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  __val = lVar14 >> 3;
  uVar13 = 1;
  if (9 < __val) {
    uVar11 = __val;
    uVar9 = 4;
    do {
      uVar13 = uVar9;
      if (uVar11 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_0010a32f;
      }
      if (uVar11 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_0010a32f;
      }
      if (uVar11 < 10000) goto LAB_0010a32f;
      bVar8 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      uVar9 = uVar13 + 4;
    } while (bVar8);
    uVar13 = uVar13 + 1;
  }
LAB_0010a32f:
  local_418[0].first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_418[0].first,(ulong)uVar13,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_418[0].first._M_dataplus._M_p,(uint)local_418[0].first._M_string_length,__val);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_418[0].first,0,0,"encountered ",0xc);
  local_1b8._0_8_ = (pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._0_8_ == paVar12) {
    local_1b8._16_8_ = paVar12->_M_allocated_capacity;
    local_1b8._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
    local_1b8._0_8_ = local_1b8 + 0x10;
  }
  else {
    local_1b8._16_8_ = paVar12->_M_allocated_capacity;
  }
  local_1b8._8_8_ = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8," elements named <registry> but only one is allowed");
  local_360._0_8_ = (pbVar10->_M_dataplus)._M_p;
  paVar12 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._0_8_ == paVar12) {
    local_360._16_8_ = paVar12->_M_allocated_capacity;
    local_360._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
    local_360._0_8_ = local_360 + 0x10;
  }
  else {
    local_360._16_8_ = paVar12->_M_allocated_capacity;
  }
  local_360._8_8_ = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  checkForError(lVar14 == 8,line,(string *)local_360);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,(ulong)(local_360._16_8_ + 1));
  }
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418[0].first._M_dataplus._M_p != paVar3) {
    operator_delete(local_418[0].first._M_dataplus._M_p,
                    local_418[0].first.field_2._M_allocated_capacity + 1);
  }
  this_00 = (VulkanHppGenerator *)
            *local_458.
             super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  readRegistry(this,(XMLElement *)this_00);
  filterLenMembers(this);
  checkCorrectness(this);
  handleRemovals(this);
  pFVar6 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (requiredBy = (this->m_features).
                    super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
                    ._M_impl.super__Vector_impl_data._M_start; requiredBy != pFVar6;
      requiredBy = requiredBy + 1) {
    this_00 = (VulkanHppGenerator *)&requiredBy->requireData;
    addCommandsToHandle(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                              *)this_00);
    addMissingFlagBits(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                             *)this_00,&requiredBy->name);
  }
  pEVar7 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar15 = (this->m_extensions).
                 super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                 ._M_impl.super__Vector_impl_data._M_start; pEVar15 != pEVar7; pEVar15 = pEVar15 + 1
      ) {
    this_00 = (VulkanHppGenerator *)&pEVar15->requireData;
    addCommandsToHandle(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                              *)this_00);
    addMissingFlagBits(this,(vector<VulkanHppGenerator::RequireData,_std::allocator<VulkanHppGenerator::RequireData>_>
                             *)this_00,&pEVar15->name);
  }
  partitionDefines((DefinesPartition *)local_360,this_00,local_420);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
           *)local_428);
  if ((_Base_ptr)local_360._16_8_ != (_Base_ptr)0x0) {
    (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_360._8_4_;
    (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)local_360._16_8_;
    (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_360._24_8_;
    (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)auStack_340._0_8_;
    *(_Base_ptr *)(local_360._16_8_ + 8) = local_438;
    (this->m_definesPartition).callees._M_t._M_impl.super__Rb_tree_header._M_node_count =
         auStack_340._8_8_;
    local_360._16_8_ = (_Base_ptr)0x0;
    auStack_340._8_8_ = 0;
    local_360._24_8_ = (_Base_ptr)(local_360 + 8);
    auStack_340._0_8_ = (_Base_ptr)(local_360 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  ::clear(&(this->m_definesPartition).callers._M_t);
  if ((_Base_ptr)auStack_340._32_8_ != (_Base_ptr)0x0) {
    (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         auStack_340._24_4_;
    (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)auStack_340._32_8_;
    (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)auStack_340._40_8_;
    (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)auStack_340._48_8_;
    *(_Base_ptr *)(auStack_340._32_8_ + 8) = local_430;
    (this->m_definesPartition).callers._M_t._M_impl.super__Rb_tree_header._M_node_count = local_308;
    auStack_340._32_8_ = (_Base_ptr)0x0;
    local_308 = 0;
    auStack_340._40_8_ = (_Base_ptr)(auStack_340 + 0x18);
    auStack_340._48_8_ = (_Base_ptr)(auStack_340 + 0x18);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  ::clear(&(this->m_definesPartition).values._M_t);
  if (local_300[0]._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_300[0]._M_impl.super__Rb_tree_header;
    (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_300[0]._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_300[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
    (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_300[0]._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_300[0]._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_300[0]._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header
    ;
    (this->m_definesPartition).values._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_300[0]._M_impl.super__Rb_tree_header._M_node_count;
    local_300[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_300[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_300[0]._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_300[0]._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  ::~_Rb_tree(local_300);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
               *)(auStack_340 + 0x10));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::DefineData>_>_>
               *)local_360);
  if (local_458.
      super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.
                    super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_458.
                          super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.
                          super__Vector_base<const_tinyxml2::XMLElement_*,_std::allocator<const_tinyxml2::XMLElement_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

VulkanHppGenerator::VulkanHppGenerator( tinyxml2::XMLDocument const & document, std::string const & api ) : m_api( api )
{
  // insert the default "handle" without class (for createInstance, and such)
  m_handles.insert( { "", {} } );

  // read the document and check its correctness
  const int                                 line     = document.GetLineNum();
  std::vector<tinyxml2::XMLElement const *> elements = getChildElements( &document );
  checkElements( line, elements, { { "registry", true } } );
  checkForError( elements.size() == 1, line, "encountered " + std::to_string( elements.size() ) + " elements named <registry> but only one is allowed" );
  readRegistry( elements[0] );
  filterLenMembers();
  checkCorrectness();
  handleRemovals();

  // add the commands to the respective handles
  // some "FlagBits" enums are not specified, but needed for our "Flags" handling -> add them here
  for ( auto & feature : m_features )
  {
    addCommandsToHandle( feature.requireData );
    addMissingFlagBits( feature.requireData, feature.name );
  }
  for ( auto & extension : m_extensions )
  {
    addCommandsToHandle( extension.requireData );
    addMissingFlagBits( extension.requireData, extension.name );
  }

  m_definesPartition = partitionDefines( m_defines );
}